

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_Write3dmBufferArchive::Internal_SeekFromCurrentPositionOverride
          (ON_Write3dmBufferArchive *this,int offset)

{
  bool local_15;
  bool rc;
  int offset_local;
  ON_Write3dmBufferArchive *this_local;
  
  local_15 = false;
  if (this->m_buffer != (uchar *)0x0) {
    if (offset < 0) {
      local_15 = (ulong)(long)-offset <= this->m_buffer_position;
      if (local_15) {
        this->m_buffer_position = this->m_buffer_position - (long)-offset;
      }
    }
    else {
      this->m_buffer_position = (long)offset + this->m_buffer_position;
      local_15 = true;
    }
  }
  return local_15;
}

Assistant:

bool ON_Write3dmBufferArchive::Internal_SeekFromCurrentPositionOverride( int offset )
{
  bool rc = false;
  if ( m_buffer )
  {
    if (offset >= 0 )
    {
      m_buffer_position += offset;
      rc = true;
    }
    else if ( size_t(-offset) <= m_buffer_position )
    {
      m_buffer_position -= (size_t(-offset));
      rc = true;
    }
  }
  return rc;
}